

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * __thiscall
httplib::SocketStream::get_remote_addr_abi_cxx11_(string *__return_storage_ptr__,SocketStream *this)

{
  socket_t in_EDX;
  
  detail::get_remote_addr_abi_cxx11_
            (__return_storage_ptr__,(detail *)(ulong)(uint)this->sock_,in_EDX);
  return __return_storage_ptr__;
}

Assistant:

inline std::string SocketStream::get_remote_addr() const {
    return detail::get_remote_addr(sock_);
}